

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

Layout * deqp::gles31::Functional::anon_unknown_0::generateRandomUniformBlockLayout
                   (Layout *__return_storage_ptr__,Random *rnd)

{
  deBool dVar1;
  deUint32 dVar2;
  
  glu::Layout::Layout(__return_storage_ptr__,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  dVar1 = deRandom_getBool(&rnd->m_rnd);
  if (dVar1 == 1) {
    dVar2 = deRandom_getUint32(&rnd->m_rnd);
    __return_storage_ptr__->binding = dVar2 % 6;
  }
  dVar1 = deRandom_getBool(&rnd->m_rnd);
  if (dVar1 == 1) {
    dVar1 = deRandom_getBool(&rnd->m_rnd);
    __return_storage_ptr__->matrixOrder = (uint)(dVar1 != 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static glu::Layout generateRandomUniformBlockLayout (de::Random& rnd)
{
	glu::Layout layout;

	if (rnd.getBool())
		layout.binding = rnd.getInt(0, 5);

	if (rnd.getBool())
		layout.matrixOrder = (rnd.getBool()) ? (glu::MATRIXORDER_COLUMN_MAJOR) : (glu::MATRIXORDER_ROW_MAJOR);

	return layout;
}